

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O0

void __thiscall
Js::JavascriptProxy::ExtractSnapObjectDataInto
          (JavascriptProxy *this,SnapObject *objData,SlabAllocator *alloc)

{
  bool bVar1;
  SnapProxyInfo *addtlInfo;
  unsigned_long *dependsOnArray;
  RecyclableObject **ppRVar2;
  TTD_PTR_ID *depOnArray;
  uint32 depOnCount;
  uint32 reserveSize;
  SnapProxyInfo *spi;
  SlabAllocator *alloc_local;
  SnapObject *objData_local;
  JavascriptProxy *this_local;
  
  addtlInfo = TTD::SlabAllocatorBase<0>::SlabAllocateStruct<TTD::NSSnapObjects::SnapProxyInfo>
                        (alloc);
  depOnArray._0_4_ = 0;
  dependsOnArray = TTD::SlabAllocatorBase<0>::SlabReserveArraySpace<unsigned_long>(alloc,2);
  addtlInfo->HandlerId = 0;
  ppRVar2 = Memory::WriteBarrierPtr::operator_cast_to_RecyclableObject__
                      ((WriteBarrierPtr *)&this->handler);
  if (*ppRVar2 != (RecyclableObject *)0x0) {
    ppRVar2 = Memory::PointerValue<Js::RecyclableObject>(&this->handler);
    addtlInfo->HandlerId = (TTD_PTR_ID)*ppRVar2;
    ppRVar2 = Memory::WriteBarrierPtr::operator_cast_to_RecyclableObject__
                        ((WriteBarrierPtr *)&this->handler);
    bVar1 = TTD::JsSupport::IsVarComplexKind(*ppRVar2);
    if (bVar1) {
      ppRVar2 = Memory::PointerValue<Js::RecyclableObject>(&this->handler);
      *dependsOnArray = (unsigned_long)*ppRVar2;
    }
    depOnArray._0_4_ = (uint)bVar1;
  }
  addtlInfo->TargetId = 0;
  ppRVar2 = Memory::WriteBarrierPtr::operator_cast_to_RecyclableObject__
                      ((WriteBarrierPtr *)&this->target);
  if (*ppRVar2 != (RecyclableObject *)0x0) {
    ppRVar2 = Memory::PointerValue<Js::RecyclableObject>(&this->target);
    addtlInfo->TargetId = (TTD_PTR_ID)*ppRVar2;
    ppRVar2 = Memory::WriteBarrierPtr::operator_cast_to_RecyclableObject__
                        ((WriteBarrierPtr *)&this->handler);
    bVar1 = TTD::JsSupport::IsVarComplexKind(*ppRVar2);
    if (bVar1) {
      ppRVar2 = Memory::PointerValue<Js::RecyclableObject>(&this->target);
      dependsOnArray[(uint)depOnArray] = (unsigned_long)*ppRVar2;
      depOnArray._0_4_ = (uint)depOnArray + 1;
    }
  }
  if ((uint)depOnArray == 0) {
    TTD::SlabAllocatorBase<0>::SlabAbortArraySpace<unsigned_long>(alloc,2);
    TTD::NSSnapObjects::
    StdExtractSetKindSpecificInfo<TTD::NSSnapObjects::SnapProxyInfo*,(TTD::NSSnapObjects::SnapObjectType)27>
              (objData,addtlInfo);
  }
  else {
    TTD::SlabAllocatorBase<0>::SlabCommitArraySpace<unsigned_long>(alloc,(ulong)(uint)depOnArray,2);
    TTD::NSSnapObjects::
    StdExtractSetKindSpecificInfo<TTD::NSSnapObjects::SnapProxyInfo*,(TTD::NSSnapObjects::SnapObjectType)27>
              (objData,addtlInfo,alloc,(uint)depOnArray,dependsOnArray);
  }
  return;
}

Assistant:

void JavascriptProxy::ExtractSnapObjectDataInto(TTD::NSSnapObjects::SnapObject* objData, TTD::SlabAllocator& alloc)
    {
        TTD::NSSnapObjects::SnapProxyInfo* spi = alloc.SlabAllocateStruct<TTD::NSSnapObjects::SnapProxyInfo>();

        const uint32 reserveSize = 2;
        uint32 depOnCount = 0;
        TTD_PTR_ID* depOnArray = alloc.SlabReserveArraySpace<TTD_PTR_ID>(reserveSize);

        spi->HandlerId = TTD_INVALID_PTR_ID;
        if(this->handler != nullptr)
        {
            spi->HandlerId = TTD_CONVERT_VAR_TO_PTR_ID(this->handler);

            if(TTD::JsSupport::IsVarComplexKind(this->handler))
            {
                depOnArray[depOnCount] = TTD_CONVERT_VAR_TO_PTR_ID(this->handler);
                depOnCount++;
            }
        }

        spi->TargetId = TTD_INVALID_PTR_ID;
        if(this->target != nullptr)
        {
            spi->TargetId = TTD_CONVERT_VAR_TO_PTR_ID(this->target);

            if(TTD::JsSupport::IsVarComplexKind(this->handler))
            {
                depOnArray[depOnCount] = TTD_CONVERT_VAR_TO_PTR_ID(this->target);
                depOnCount++;
            }
        }

        if(depOnCount == 0)
        {
            alloc.SlabAbortArraySpace<TTD_PTR_ID>(reserveSize);

            TTD::NSSnapObjects::StdExtractSetKindSpecificInfo<TTD::NSSnapObjects::SnapProxyInfo*, TTD::NSSnapObjects::SnapObjectType::SnapProxyObject>(objData, spi);
        }
        else
        {
            alloc.SlabCommitArraySpace<TTD_PTR_ID>(depOnCount, reserveSize);

            TTD::NSSnapObjects::StdExtractSetKindSpecificInfo<TTD::NSSnapObjects::SnapProxyInfo*, TTD::NSSnapObjects::SnapObjectType::SnapProxyObject>(objData, spi, alloc, depOnCount, depOnArray);
        }
    }